

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt_endpoint_refiner::refine(dxt_endpoint_refiner *this,params *p,results *r)

{
  ushort uVar1;
  double dVar2;
  double val;
  ulong uVar3;
  vec<3U,_double> *rhs;
  undefined1 auVar4 [16];
  float fVar5;
  vec<3U,_double> a;
  vec<3U,_double> b;
  vec3F l;
  vec3F h;
  vec<3U,_double> first_color;
  vec<3U,_double> betax_sum;
  vec<3U,_double> alphax_sum;
  double local_188;
  double dStack_180;
  double local_168;
  vec<3U,_double> local_148;
  vec<3U,_double> local_128;
  results *local_110;
  vec<3U,_double> local_108;
  vec<3U,_double> local_f0;
  vec<3U,_double> local_d8;
  vec<3U,_double> local_c0;
  vec<3U,_double> local_a8;
  vec<3U,_double> local_90;
  vec<3U,_float> local_78;
  vec<3U,_float> local_6c;
  vec<3U,_float> local_60;
  vec<3U,_float> local_54;
  vec<3U,_double> local_48;
  
  if (p->m_num_pixels != 0) {
    this->m_pParams = p;
    this->m_pResults = r;
    r->m_error = 0xffffffffffffffff;
    r->m_low_color = 0;
    r->m_high_color = 0;
    local_168 = 0.0;
    local_110 = r;
    vec<3U,_double>::set(&local_a8,0.0);
    vec<3U,_double>::set(&local_c0,0.0);
    vec<3U,_double>::set(&local_d8,0.0);
    local_188 = 0.0;
    dStack_180 = 0.0;
    for (uVar3 = 0; uVar3 < p->m_num_pixels; uVar3 = uVar3 + 1) {
      if (p->m_dxt1_selectors == true) {
        fVar5 = (float)(byte)(&g_dxt1_to_linear)[p->m_pSelectors[uVar3]] / 3.0;
        local_148.m_s[2] = (double)((float)p->m_pPixels[uVar3].field_0.field_0.b / 255.0);
        uVar1 = *(ushort *)&p->m_pPixels[uVar3].field_0;
        auVar4._0_4_ = (float)(uVar1 & 0xff);
        auVar4._4_4_ = (float)(byte)(uVar1 >> 8);
        auVar4._8_8_ = 0;
        auVar4 = divps(auVar4,_DAT_001952e0);
        local_148.m_s[0] = (double)auVar4._0_4_;
        local_148.m_s[1] = (double)auVar4._4_4_;
      }
      else {
        fVar5 = (float)*(byte *)((long)&g_dxt5_to_linear + (ulong)p->m_pSelectors[uVar3]) / 7.0;
        vec<3U,_double>::set
                  (&local_148,
                   (double)((float)p->m_pPixels[uVar3].field_0.c[p->m_alpha_comp_index] / 255.0));
      }
      if (uVar3 == 0) {
        vec<3U,_double>::operator=(&local_d8,&local_148);
      }
      val = (double)fVar5;
      dVar2 = 1.0 - val;
      local_168 = local_168 + dVar2 * dVar2;
      local_188 = local_188 + val * val;
      dStack_180 = dStack_180 + val * dVar2;
      operator*(dVar2,&local_148);
      vec<3U,_double>::operator+=(&local_a8,&local_128);
      operator*(val,&local_148);
      vec<3U,_double>::operator+=(&local_c0,&local_128);
    }
    if ((local_188 != 0.0) || (NAN(local_188))) {
      if ((local_168 != 0.0) || (NAN(local_168))) {
        dVar2 = local_168 * local_188 - dStack_180 * dStack_180;
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          operator*(&local_a8,local_188);
          operator*(&local_c0,dStack_180);
          operator-(&local_f0,&local_90);
          operator/(&local_108,dVar2);
          vec<3U,_double>::operator=(&local_148,&local_128);
          operator*(&local_c0,local_168);
          operator*(&local_a8,dStack_180);
          operator-(&local_90,&local_48);
          rhs = &local_108;
          operator/(&local_f0,dVar2);
        }
        else {
          rhs = &local_d8;
          vec<3U,_double>::operator=(&local_148,rhs);
        }
      }
      else {
        vec<3U,_double>::clear(&local_148);
        rhs = &local_108;
        operator/(&local_c0,local_188);
      }
      vec<3U,_double>::operator=(&local_128,rhs);
    }
    else {
      operator/(&local_a8,local_168);
      vec<3U,_double>::operator=(&local_148,&local_128);
      vec<3U,_double>::clear(&local_128);
    }
    vec<3U,_float>::set((vec<3U,_float> *)&local_108,0.0);
    vec<3U,_float>::set((vec<3U,_float> *)&local_f0,0.0);
    vec<3u,float>::operator=((vec<3u,float> *)&local_108,&local_148);
    vec<3u,float>::operator=((vec<3u,float> *)&local_f0,&local_128);
    vec<3U,_float>::clamp((vec<3U,_float> *)&local_108,0.0,1.0);
    vec<3U,_float>::clamp((vec<3U,_float> *)&local_f0,0.0,1.0);
    if (p->m_dxt1_selectors == true) {
      vec<3U,_float>::vec(&local_54,(vec<3U,_float> *)&local_108);
      vec<3U,_float>::vec(&local_60,(vec<3U,_float> *)&local_f0);
      optimize_dxt1(this,&local_54,&local_60);
    }
    else {
      vec<3U,_float>::vec(&local_6c,(vec<3U,_float> *)&local_108);
      vec<3U,_float>::vec(&local_78,(vec<3U,_float> *)&local_f0);
      optimize_dxt5(this,&local_6c,&local_78);
    }
    return local_110->m_error < p->m_error_to_beat;
  }
  return false;
}

Assistant:

bool dxt_endpoint_refiner::refine(const params& p, results& r) {
  if (!p.m_num_pixels)
    return false;

  m_pParams = &p;
  m_pResults = &r;

  r.m_error = cUINT64_MAX;
  r.m_low_color = 0;
  r.m_high_color = 0;

  double alpha2_sum = 0.0f;
  double beta2_sum = 0.0f;
  double alphabeta_sum = 0.0f;

  vec<3, double> alphax_sum(0.0f);
  vec<3, double> betax_sum(0.0f);

  vec<3, double> first_color(0.0f);

  // This linear solver is from Squish.
  for (uint i = 0; i < p.m_num_pixels; ++i) {
    uint8 c = p.m_pSelectors[i];

    double k;
    if (p.m_dxt1_selectors)
      k = g_dxt1_to_linear[c] * 1.0f / 3.0f;
    else
      k = g_dxt5_to_linear[c] * 1.0f / 7.0f;

    double alpha = 1.0f - k;
    double beta = k;

    vec<3, double> x;

    if (p.m_dxt1_selectors)
      x.set(p.m_pPixels[i][0] * 1.0f / 255.0f, p.m_pPixels[i][1] * 1.0f / 255.0f, p.m_pPixels[i][2] * 1.0f / 255.0f);
    else
      x.set(p.m_pPixels[i][p.m_alpha_comp_index] / 255.0f);

    if (!i)
      first_color = x;

    alpha2_sum += alpha * alpha;
    beta2_sum += beta * beta;
    alphabeta_sum += alpha * beta;
    alphax_sum += alpha * x;
    betax_sum += beta * x;
  }

  // zero where non-determinate
  vec<3, double> a, b;
  if (beta2_sum == 0.0f) {
    a = alphax_sum / alpha2_sum;
    b.clear();
  } else if (alpha2_sum == 0.0f) {
    a.clear();
    b = betax_sum / beta2_sum;
  } else {
    double factor = alpha2_sum * beta2_sum - alphabeta_sum * alphabeta_sum;
    if (factor != 0.0f) {
      a = (alphax_sum * beta2_sum - betax_sum * alphabeta_sum) / factor;
      b = (betax_sum * alpha2_sum - alphax_sum * alphabeta_sum) / factor;
    } else {
      a = first_color;
      b = first_color;
    }
  }

  vec3F l(0.0f), h(0.0f);
  l = a;
  h = b;

  l.clamp(0.0f, 1.0f);
  h.clamp(0.0f, 1.0f);

  if (p.m_dxt1_selectors)
    optimize_dxt1(l, h);
  else
    optimize_dxt5(l, h);

  return r.m_error < p.m_error_to_beat;
}